

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *
qSelectionPersistentRowLengths
          (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *__return_storage_ptr__,
          QItemSelection *sel)

{
  QList<QItemSelectionRange> *pQVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QAbstractItemModel *pQVar7;
  long in_RDX;
  uint uVar8;
  QItemSelectionRange *range;
  long in_FS_OFFSET;
  uint width;
  undefined1 *local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  uint local_5c;
  undefined8 local_58;
  undefined1 *puStack_50;
  QAbstractItemModel *local_48;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *local_38;
  
  local_38 = *(QList<std::pair<QPersistentModelIndex,_unsigned_int>_> **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (pair<QPersistentModelIndex,_unsigned_int> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (in_RDX != 0) {
    pQVar1 = &sel->super_QList<QItemSelectionRange>;
    do {
      bVar3 = QItemSelectionRange::isValid((QItemSelectionRange *)sel);
      if (bVar3) {
        pQVar7 = QPersistentModelIndex::model((QPersistentModelIndex *)sel);
        if (pQVar7 != (QAbstractItemModel *)0x0) {
          local_48 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)sel);
          iVar4 = QPersistentModelIndex::row(&((QItemSelectionRange *)sel)->br);
          iVar5 = QPersistentModelIndex::column(&((QItemSelectionRange *)sel)->br);
          iVar6 = QPersistentModelIndex::column((QPersistentModelIndex *)sel);
          local_5c = (iVar5 - iVar6) + 1;
          if ((int)(uint)local_58 <= iVar4) {
            uVar2 = local_58._4_4_;
            uVar8 = (uint)local_58;
            do {
              if (local_48 == (QAbstractItemModel *)0x0) {
                local_78 = (undefined1 *)0xffffffffffffffff;
                puStack_70 = (undefined1 *)0x0;
                local_68.ptr = (QAbstractItemModel *)0x0;
              }
              else if ((uVar8 == (uint)local_58) && (local_58._4_4_ == uVar2)) {
                local_68.ptr = local_48;
                local_78 = local_58;
                puStack_70 = puStack_50;
              }
              else {
                (*(local_48->super_QObject)._vptr_QObject[0xe])
                          ((QModelIndex *)&local_78,local_48,(ulong)uVar8,(ulong)uVar2,&local_58);
              }
              QtPrivate::QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>>::
              emplace<QModelIndex,unsigned_int_const&>
                        ((QMovableArrayOps<std::pair<QPersistentModelIndex,unsigned_int>> *)
                         __return_storage_ptr__,(__return_storage_ptr__->d).size,
                         (QModelIndex *)&local_78,&local_5c);
              QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end(__return_storage_ptr__);
              uVar8 = uVar8 + 1;
            } while (iVar4 + 1U != uVar8);
          }
        }
      }
      sel = (QItemSelection *)((long)sel + 0x10);
    } while ((QItemSelectionRange *)sel != (QItemSelectionRange *)(&(pQVar1->d).d + in_RDX * 2));
  }
  if (*(QList<std::pair<QPersistentModelIndex,_unsigned_int>_> **)(in_FS_OFFSET + 0x28) == local_38)
  {
    return *(QList<std::pair<QPersistentModelIndex,_unsigned_int>_> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QList<std::pair<QPersistentModelIndex, uint>> qSelectionPersistentRowLengths(const QItemSelection &sel)
{
    QList<std::pair<QPersistentModelIndex, uint>> result;
    for (const QItemSelectionRange &range : sel)
        rowLengthsFromRange(range, result);
    return result;
}